

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCountedObjectImpl.hpp
# Opt level: O0

void __thiscall
Diligent::RefCountersImpl::ObjectWrapper<Diligent::QueryVkImpl,_Diligent::FixedBlockMemoryAllocator>
::DestroyObject(ObjectWrapper<Diligent::QueryVkImpl,_Diligent::FixedBlockMemoryAllocator> *this)

{
  QueryVkImpl *this_00;
  void *in_RSI;
  ObjectWrapper<Diligent::QueryVkImpl,_Diligent::FixedBlockMemoryAllocator> *this_local;
  
  if (this->m_pAllocator == (FixedBlockMemoryAllocator *)0x0) {
    this_00 = this->m_pObject;
    if (this_00 != (QueryVkImpl *)0x0) {
      QueryVkImpl::~QueryVkImpl(this_00);
      RefCountedObject<Diligent::IQueryVk>::operator_delete
                ((RefCountedObject<Diligent::IQueryVk> *)this_00,in_RSI);
    }
  }
  else {
    QueryVkImpl::~QueryVkImpl(this->m_pObject);
    FixedBlockMemoryAllocator::Free(this->m_pAllocator,this->m_pObject);
  }
  return;
}

Assistant:

virtual void DestroyObject() override final
        {
            if (m_pAllocator)
            {
                m_pObject->~ObjectType();
                m_pAllocator->Free(m_pObject);
            }
            else
            {
                delete m_pObject;
            }
        }